

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O1

Scalar * __thiscall
PatternGeneration::getRandomColor(Scalar *__return_storage_ptr__,PatternGeneration *this)

{
  uniform_int_distribution<int> *puVar1;
  uint uVar2;
  result_type rVar3;
  result_type rVar4;
  result_type rVar5;
  ulong uVar6;
  size_t __i;
  long lVar7;
  undefined1 local_2738 [8];
  random_device rd;
  mt19937 mt;
  
  std::random_device::random_device((random_device *)local_2738);
  uVar2 = std::random_device::_M_getval();
  rd.field_0._M_mt._M_p = (size_t)uVar2;
  lVar7 = 1;
  uVar6 = rd.field_0._M_mt._M_p;
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar7);
    mt._M_x[lVar7 + -1] = uVar6;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x270);
  puVar1 = (this->dist).
           super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (puVar1,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)((long)&rd.field_0 + 0x1380),&puVar1->_M_param);
  puVar1 = (this->dist).
           super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  rVar4 = std::uniform_int_distribution<int>::operator()
                    (puVar1,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)((long)&rd.field_0 + 0x1380),&puVar1->_M_param);
  puVar1 = (this->dist).
           super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  rVar5 = std::uniform_int_distribution<int>::operator()
                    (puVar1,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)((long)&rd.field_0 + 0x1380),&puVar1->_M_param);
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0] = 0.0;
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1] = 0.0;
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2] = 0.0;
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3] = 0.0;
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0] =
       (double)(rVar3 % 0xff);
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1] =
       (double)(rVar4 % 0xff);
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2] =
       (double)(rVar5 % 0xff);
  (__return_storage_ptr__->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3] = 0.0;
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

cv::Scalar PatternGeneration::getRandomColor()
{
    std::random_device rd;
    std::mt19937 mt(rd());

    return cv::Scalar( (*dist)(mt)%255, (*dist)(mt)%255, (*dist)(mt)%255);
}